

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log_test.c
# Opt level: O0

char * log_reader_fails_with_incorrect_version(void)

{
  int iVar1;
  FILE *pFVar2;
  int r;
  FILE *log_file;
  hdr_log_reader reader;
  char *file_name;
  char *log_with_invalid_version;
  
  reader.start_timestamp.tv_nsec = (__syscall_slong_t)anon_var_dwarf_5c5;
  pFVar2 = fopen("histogram_with_invalid_version.log","w+");
  fprintf(pFVar2,"%s",
          "#[Test log]\n#[Histogram log format version 1.04]\n#[StartTime: 1404700005.222 (seconds since epoch), Mon Jul 02:26:45 GMT 2014]\nStartTimestamp\",\"EndTimestamp\",\"Interval_Max\",\"Interval_Compressed_Histogram\"\n"
         );
  fflush(pFVar2);
  fclose(pFVar2);
  pFVar2 = fopen((char *)reader.start_timestamp.tv_nsec,"r");
  hdr_log_reader_init((hdr_log_reader *)&log_file);
  iVar1 = hdr_log_read_header((hdr_log_reader *)&log_file,(FILE *)pFVar2);
  if (iVar1 == -0x7529) {
    fclose(pFVar2);
    remove((char *)reader.start_timestamp.tv_nsec);
    log_with_invalid_version = (char *)0x0;
  }
  else {
    log_with_invalid_version = "Should error with incorrect version";
  }
  return log_with_invalid_version;
}

Assistant:

static char* log_reader_fails_with_incorrect_version(void)
{
    const char* log_with_invalid_version =
    "#[Test log]\n"
    "#[Histogram log format version 1.04]\n"
    "#[StartTime: 1404700005.222 (seconds since epoch), Mon Jul 02:26:45 GMT 2014]\n"
    "StartTimestamp\",\"EndTimestamp\",\"Interval_Max\",\"Interval_Compressed_Histogram\"\n";
    const char* file_name = "histogram_with_invalid_version.log";
    struct hdr_log_reader reader;
    FILE* log_file;
    int r;

    log_file = fopen(file_name, "w+");
    fprintf(log_file, "%s", log_with_invalid_version);
    fflush(log_file);
    fclose(log_file);

    log_file = fopen(file_name, "r");
    hdr_log_reader_init(&reader);
    r = hdr_log_read_header(&reader, log_file);

    mu_assert("Should error with incorrect version", r == HDR_LOG_INVALID_VERSION);

    fclose(log_file);
    remove(file_name);

    return 0;
}